

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bandpre.c
# Opt level: O2

int cvBandPrecFree(CVodeMem cv_mem)

{
  void *__ptr;
  
  if ((cv_mem->cv_lmem != (void *)0x0) &&
     (__ptr = *(void **)((long)cv_mem->cv_lmem + 0xf0), __ptr != (void *)0x0)) {
    SUNLinSolFree(*(undefined8 *)((long)__ptr + 0x28));
    SUNMatDestroy(*(undefined8 *)((long)__ptr + 0x20));
    SUNMatDestroy(*(undefined8 *)((long)__ptr + 0x18));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x30));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x38));
    free(__ptr);
  }
  return 0;
}

Assistant:

static int cvBandPrecFree(CVodeMem cv_mem)
{
  CVLsMem cvls_mem;
  CVBandPrecData pdata;

  if (cv_mem->cv_lmem == NULL) { return (0); }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL) { return (0); }
  pdata = (CVBandPrecData)cvls_mem->P_data;

  SUNLinSolFree(pdata->LS);
  SUNMatDestroy(pdata->savedP);
  SUNMatDestroy(pdata->savedJ);
  N_VDestroy(pdata->tmp1);
  N_VDestroy(pdata->tmp2);

  free(pdata);
  pdata = NULL;

  return (0);
}